

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_functional_common.hxx
# Opt level: O3

void __thiscall raft_functional_common::TestSm::free_user_snp_ctx(TestSm *this,void **user_snp_ctx)

{
  int iVar1;
  pair<std::_Rb_tree_iterator<void_*>,_std::_Rb_tree_iterator<void_*>_> pVar2;
  
  if (*user_snp_ctx == (void *)0x0) {
    return;
  }
  free(*user_snp_ctx);
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->openedUserCtxsLock);
  if (iVar1 == 0) {
    pVar2 = std::
            _Rb_tree<void_*,_void_*,_std::_Identity<void_*>,_std::less<void_*>,_std::allocator<void_*>_>
            ::equal_range(&(this->openedUserCtxs)._M_t,user_snp_ctx);
    std::
    _Rb_tree<void_*,_void_*,_std::_Identity<void_*>,_std::less<void_*>,_std::allocator<void_*>_>::
    _M_erase_aux(&(this->openedUserCtxs)._M_t,(_Base_ptr)pVar2.first._M_node,
                 (_Base_ptr)pVar2.second._M_node);
    pthread_mutex_unlock((pthread_mutex_t *)&this->openedUserCtxsLock);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void free_user_snp_ctx(void*& user_snp_ctx) {
        if (!user_snp_ctx) return;

        int ctx = 0;
        memcpy(&ctx, user_snp_ctx, sizeof(ctx));
        // Check magic number.
        assert(ctx == 0xabcdef);
        free(user_snp_ctx);

        std::lock_guard<std::mutex> ll(openedUserCtxsLock);
        openedUserCtxs.erase(user_snp_ctx);
    }